

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O2

Vec_Int_t * Gia_VtaConvertToGla(Gia_Man_t *p,Vec_Int_t *vVta)

{
  int Entry;
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  uint uVar4;
  ulong uVar5;
  char *__assertion;
  
  uVar2 = p->nObjs;
  Entry = Vec_IntEntry(vVta,0);
  iVar1 = Vec_IntEntry(vVta,Entry + 1);
  if (iVar1 == vVta->nSize) {
    iVar1 = Abc_Base2Log(uVar2);
    uVar4 = ~(-1 << ((byte)iVar1 & 0x1f));
    if ((int)uVar2 <= (int)uVar4) {
      p_00 = Vec_IntStart(uVar2);
      iVar1 = Entry + 2;
      do {
        if (vVta->nSize <= iVar1) {
          Vec_IntWriteEntry(p_00,0,Entry);
          return p_00;
        }
        uVar2 = Vec_IntEntry(vVta,iVar1);
        uVar2 = uVar2 & uVar4;
        pObj = Gia_ManObj(p,uVar2);
        iVar3 = Gia_ObjIsRo(p,pObj);
        if (iVar3 == 0) {
          uVar5 = ~*(ulong *)pObj;
          if (((uVar5 & 0x1fffffff1fffffff) != 0) &&
             ((int)*(ulong *)pObj < 0 || (uVar5 & 0x1fffffff) == 0)) {
            __assertion = "Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj)";
            uVar2 = 0x5d;
            goto LAB_004b8822;
          }
        }
        if (p_00->nSize <= (int)uVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[uVar2] = p_00->pArray[uVar2] + 1;
        iVar1 = iVar1 + 1;
      } while( true );
    }
    __assertion = "nObjs <= nObjMask";
    uVar2 = 0x57;
  }
  else {
    __assertion = "Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)";
    uVar2 = 0x54;
  }
LAB_004b8822:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                ,uVar2,"Vec_Int_t *Gia_VtaConvertToGla(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertToGla( Gia_Man_t * p, Vec_Int_t * vVta )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vGla;
    int nObjMask, nObjs = Gia_ManObjNum(p);
    int i, Entry, nFrames = Vec_IntEntry( vVta, 0 );
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    // get the bitmask
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vGla = Vec_IntStart( nObjs );
    Vec_IntForEachEntryStart( vVta, Entry, i, nFrames+2 )
    {
        pObj = Gia_ManObj( p, (Entry &  nObjMask) );
        assert( Gia_ObjIsRo(p, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsConst0(pObj) );
        Vec_IntAddToEntry( vGla, (Entry &  nObjMask), 1 );
    }
    Vec_IntWriteEntry( vGla, 0, nFrames );
    return vGla;
}